

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launcher.cxx
# Opt level: O3

int __thiscall nuraft::raft_launcher::shutdown(raft_launcher *this,int __fd,int __how)

{
  raft_server *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar1;
  asio_service *this_02;
  uint32_t uVar2;
  int iVar3;
  undefined4 in_register_00000034;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  this_00 = (this->raft_instance_).
            super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (raft_server *)0x0) {
    iVar3 = 0;
  }
  else {
    raft_server::shutdown(this_00,__fd,__how);
    this_01 = (this->raft_instance_).
              super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->raft_instance_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->raft_instance_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    peVar1 = (this->asio_listener_).
             super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      (*peVar1->_vptr_rpc_listener[3])();
      (*((this->asio_listener_).super___shared_ptr<nuraft::rpc_listener,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_vptr_rpc_listener[4])();
    }
    this_02 = (this->asio_svc_).super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (this_02 != (asio_service *)0x0) {
      asio_service::stop(this_02);
      uVar2 = asio_service::get_active_workers
                        ((this->asio_svc_).
                         super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        );
      uVar4 = CONCAT44(in_register_00000034,__fd) * 100;
      if (uVar4 != 0 && uVar2 != 0) {
        uVar5 = 1;
        do {
          timer_helper::sleep_ms(10);
          uVar2 = asio_service::get_active_workers
                            ((this->asio_svc_).
                             super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr);
          if (uVar2 == 0) break;
          bVar6 = uVar5 < uVar4;
          uVar5 = uVar5 + 1;
        } while (bVar6);
      }
    }
    uVar2 = asio_service::get_active_workers
                      ((this->asio_svc_).
                       super___shared_ptr<nuraft::asio_service,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar3 = CONCAT31((int3)(uVar2 >> 8),uVar2 == 0);
  }
  return iVar3;
}

Assistant:

bool raft_launcher::shutdown(size_t time_limit_sec) {
    if (!raft_instance_) return false;

    raft_instance_->shutdown();
    raft_instance_.reset();

    if (asio_listener_) {
        asio_listener_->stop();
        asio_listener_->shutdown();
    }
    if (asio_svc_) {
        asio_svc_->stop();
        size_t count = 0;
        while ( asio_svc_->get_active_workers() &&
                count < time_limit_sec * 100 ) {
            // 10ms per tick.
            timer_helper::sleep_ms(10);
            count++;
        }
    }
    if (asio_svc_->get_active_workers()) return false;
    return true;
}